

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void tablerehash(TString **vect,int osize,int nsize)

{
  TString *pTVar1;
  uint uVar2;
  uint h;
  TString *hnext;
  TString *p;
  int i;
  int nsize_local;
  int osize_local;
  TString **vect_local;
  
  for (p._4_4_ = osize; p._4_4_ < nsize; p._4_4_ = p._4_4_ + 1) {
    vect[p._4_4_] = (TString *)0x0;
  }
  for (p._4_4_ = 0; p._4_4_ < osize; p._4_4_ = p._4_4_ + 1) {
    hnext = vect[p._4_4_];
    vect[p._4_4_] = (TString *)0x0;
    while (hnext != (TString *)0x0) {
      pTVar1 = (hnext->u).hnext;
      uVar2 = hnext->hash & nsize - 1U;
      hnext->u = *(anon_union_8_2_b887aad4_for_u *)(vect + uVar2);
      vect[uVar2] = hnext;
      hnext = pTVar1;
    }
  }
  return;
}

Assistant:

static void tablerehash (TString **vect, int osize, int nsize) {
  int i;
  for (i = osize; i < nsize; i++)  /* clear new elements */
    vect[i] = NULL;
  for (i = 0; i < osize; i++) {  /* rehash old part of the array */
    TString *p = vect[i];
    vect[i] = NULL;
    while (p) {  /* for each string in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, nsize);  /* new position */
      p->u.hnext = vect[h];  /* chain it into array */
      vect[h] = p;
      p = hnext;
    }
  }
}